

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

bool __thiscall
OpenMD::MoleculeStamp::addCutoffGroupStamp(MoleculeStamp *this,CutoffGroupStamp *cutoffgroup)

{
  CutoffGroupStamp *local_8;
  
  local_8 = cutoffgroup;
  std::vector<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>::push_back
            (&this->cutoffGroupStamps_,&local_8);
  return true;
}

Assistant:

bool MoleculeStamp::addCutoffGroupStamp(CutoffGroupStamp* cutoffgroup) {
    cutoffGroupStamps_.push_back(cutoffgroup);
    return true;
  }